

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator
          (ValueArray<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)> PVar1;
  vector<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int),_std::allocator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>_>
  *in_stack_ffffffffffffffc0;
  vector<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int),_std::allocator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>_>
  *in_stack_ffffffffffffffc8;
  ValueArray<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)> local_28 [5];
  
  ValueArray<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int)>::
  MakeVector<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int),0ul>(local_28,in_RSI);
  ValuesIn<std::vector<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int),std::allocator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int)>>>
            (in_stack_ffffffffffffffc8);
  std::
  vector<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int),_std::allocator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>_>
  ::~vector(in_stack_ffffffffffffffc0);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }